

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O0

Frc_Man_t * Frc_ManStartSimple(Gia_Man_t *pGia)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Frc_Man_t *p_00;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Gia_Obj_t *pGVar7;
  Frc_Obj_t *pFVar8;
  Frc_Obj_t *pFVar9;
  bool bVar10;
  uint local_3c;
  int local_38;
  int hHandle;
  int nNodes;
  int i;
  Gia_Obj_t *pObj;
  Frc_Obj_t *pFanLog;
  Frc_Obj_t *pObjLog;
  Frc_Man_t *p;
  Gia_Man_t *pGia_local;
  
  Gia_ManCreateRefs(pGia);
  p_00 = (Frc_Man_t *)calloc(1,0x38);
  p_00->pGia = pGia;
  iVar1 = Gia_ManRegNum(pGia);
  p_00->nRegs = iVar1;
  iVar1 = Gia_ManCiNum(pGia);
  pVVar5 = Vec_IntAlloc(iVar1);
  p_00->vCis = pVVar5;
  iVar1 = Gia_ManCoNum(pGia);
  pVVar5 = Vec_IntAlloc(iVar1);
  p_00->vCos = pVVar5;
  iVar1 = Gia_ManObjNum(pGia);
  iVar2 = Gia_ManAndNum(pGia);
  iVar3 = Gia_ManCoNum(pGia);
  p_00->nObjData = iVar1 * 6 + (iVar2 * 2 + iVar3) * 2;
  piVar6 = (int *)calloc((long)p_00->nObjData,4);
  p_00->pObjData = piVar6;
  pGVar7 = Gia_ManConst0(pGia);
  pGVar7->Value = 0;
  pFVar8 = Frc_ManObj(p_00,0);
  pFVar8->hHandle = 0;
  *(uint *)pFVar8 = *(uint *)pFVar8 & 0xf;
  pGVar7 = Gia_ManConst0(pGia);
  uVar4 = Gia_ObjRefNum(pGia,pGVar7);
  pFVar8->nFanouts = uVar4;
  local_3c = Frc_ObjSize(pFVar8);
  local_38 = 1;
  p_00->nObjs = p_00->nObjs + 1;
  hHandle = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pGia->vCis);
    bVar10 = false;
    if (hHandle < iVar1) {
      _nNodes = Gia_ManCi(pGia,hHandle);
      bVar10 = _nNodes != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    _nNodes->Value = local_3c;
    Vec_IntPush(p_00->vCis,local_3c);
    pFVar8 = Frc_ManObj(p_00,local_3c);
    pFVar8->hHandle = local_3c;
    *(uint *)pFVar8 = *(uint *)pFVar8 & 0xf;
    uVar4 = Gia_ObjRefNum(pGia,_nNodes);
    pFVar8->nFanouts = uVar4;
    *(uint *)pFVar8 = *(uint *)pFVar8 & 0xfffffffe;
    iVar1 = Frc_ObjSize(pFVar8);
    local_3c = iVar1 + local_3c;
    p_00->nObjs = p_00->nObjs + 1;
    hHandle = hHandle + 1;
  }
  hHandle = 0;
  while( true ) {
    bVar10 = false;
    if (hHandle < pGia->nObjs) {
      _nNodes = Gia_ManObj(pGia,hHandle);
      bVar10 = _nNodes != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    iVar1 = Gia_ObjIsAnd(_nNodes);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjRefNum(pGia,_nNodes);
      if (iVar1 < 1) {
        __assert_fail("Gia_ObjRefNum( pGia, pObj ) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                      ,0xc2,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
      }
      _nNodes->Value = local_3c;
      pFVar8 = Frc_ManObj(p_00,local_3c);
      pFVar8->hHandle = local_3c;
      *(uint *)pFVar8 = *(uint *)pFVar8 & 0xf | 0x20;
      uVar4 = Gia_ObjRefNum(pGia,_nNodes);
      pFVar8->nFanouts = uVar4;
      pGVar7 = Gia_ObjFanin0(_nNodes);
      iVar1 = Gia_ObjValue(pGVar7);
      pFVar9 = Frc_ManObj(p_00,iVar1);
      Frc_ObjAddFanin(pFVar8,pFVar9);
      pGVar7 = Gia_ObjFanin1(_nNodes);
      iVar1 = Gia_ObjValue(pGVar7);
      pFVar9 = Frc_ManObj(p_00,iVar1);
      Frc_ObjAddFanin(pFVar8,pFVar9);
      iVar1 = Frc_ObjSize(pFVar8);
      local_3c = iVar1 + local_3c;
      local_38 = local_38 + 1;
      p_00->nObjs = p_00->nObjs + 1;
    }
    hHandle = hHandle + 1;
  }
  hHandle = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pGia->vCos);
    bVar10 = false;
    if (hHandle < iVar1) {
      _nNodes = Gia_ManCo(pGia,hHandle);
      bVar10 = _nNodes != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    _nNodes->Value = local_3c;
    Vec_IntPush(p_00->vCos,local_3c);
    pFVar8 = Frc_ManObj(p_00,local_3c);
    pFVar8->hHandle = local_3c;
    *(uint *)pFVar8 = *(uint *)pFVar8 & 0xf | 0x10;
    pFVar8->nFanouts = 0;
    *(uint *)pFVar8 = *(uint *)pFVar8 & 0xfffffffd | 2;
    pGVar7 = Gia_ObjFanin0(_nNodes);
    iVar1 = Gia_ObjValue(pGVar7);
    pFVar9 = Frc_ManObj(p_00,iVar1);
    Frc_ObjAddFanin(pFVar8,pFVar9);
    iVar1 = Frc_ObjSize(pFVar8);
    local_3c = iVar1 + local_3c;
    p_00->nObjs = p_00->nObjs + 1;
    hHandle = hHandle + 1;
  }
  iVar1 = Frc_ManNodeNum(p_00);
  if (local_38 == iVar1) {
    if (local_3c != p_00->nObjData) {
      __assert_fail("hHandle == p->nObjData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                    ,0xe9,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
    }
    if (local_3c != p_00->nObjData) {
      printf("Frc_ManStartSimple(): Fatal error in internal representation.\n");
    }
    hHandle = 0;
    do {
      bVar10 = false;
      if (hHandle < pGia->nObjs) {
        _nNodes = Gia_ManObj(pGia,hHandle);
        bVar10 = _nNodes != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) {
        if (pGia->pRefs != (int *)0x0) {
          free(pGia->pRefs);
          pGia->pRefs = (int *)0x0;
        }
        return p_00;
      }
      iVar1 = Gia_ObjValue(_nNodes);
      if (iVar1 != -1) {
        iVar1 = Gia_ObjValue(_nNodes);
        pFVar8 = Frc_ManObj(p_00,iVar1);
        if (*(uint *)pFVar8 >> 4 != (pFVar8->field_9).iFanin) {
          __assert_fail("pObjLog->nFanins == pObjLog->iFanin",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                        ,0xf2,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
        }
        if (pFVar8->nFanouts != pFVar8->iFanout) {
          __assert_fail("pObjLog->nFanouts == pObjLog->iFanout",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                        ,0xf3,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
        }
        pFVar8->iFanout = 0;
        (pFVar8->field_9).fEdgeCenter = 0.0;
      }
      hHandle = hHandle + 1;
    } while( true );
  }
  __assert_fail("nNodes == Frc_ManNodeNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                ,0xe8,"Frc_Man_t *Frc_ManStartSimple(Gia_Man_t *)");
}

Assistant:

Frc_Man_t * Frc_ManStartSimple( Gia_Man_t * pGia )
{
    Frc_Man_t * p;
    Frc_Obj_t * pObjLog, * pFanLog;
    Gia_Obj_t * pObj;//, * pObjRi, * pObjRo;
    int i, nNodes, hHandle = 0;
    // prepare the AIG
    Gia_ManCreateRefs( pGia );
    // create logic network
    p = ABC_CALLOC( Frc_Man_t, 1 );
    p->pGia  = pGia;
    p->nRegs = Gia_ManRegNum(pGia);
    p->vCis  = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCos  = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->nObjData = (sizeof(Frc_Obj_t) / 4) * Gia_ManObjNum(pGia) + 2 * (2 * Gia_ManAndNum(pGia) + Gia_ManCoNum(pGia));
    p->pObjData = ABC_CALLOC( int, p->nObjData );
    // create constant node
    Gia_ManConst0(pGia)->Value = hHandle;
    pObjLog = Frc_ManObj( p, hHandle );
    pObjLog->hHandle  = hHandle;
    pObjLog->nFanins  = 0;
    pObjLog->nFanouts = Gia_ObjRefNum( pGia, Gia_ManConst0(pGia) );
    // count objects
    hHandle += Frc_ObjSize( pObjLog );
    nNodes = 1;
    p->nObjs++;
    // create the PIs
    Gia_ManForEachCi( pGia, pObj, i )
    {
        // create PI object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCis, hHandle );
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 0;
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        pObjLog->fCi = 0;
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        p->nObjs++;
    }
    // create internal nodes
    Gia_ManForEachAnd( pGia, pObj, i )
    {
        assert( Gia_ObjRefNum( pGia, pObj ) > 0 );
        // create node object
        pObj->Value = hHandle;
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 2;
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        // add fanins
        pFanLog = Frc_ManObj( p, Gia_ObjValue(Gia_ObjFanin0(pObj)) ); 
        Frc_ObjAddFanin( pObjLog, pFanLog );
        pFanLog = Frc_ManObj( p, Gia_ObjValue(Gia_ObjFanin1(pObj)) ); 
        Frc_ObjAddFanin( pObjLog, pFanLog );
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        nNodes++;
        p->nObjs++;
    }
    // create the POs
    Gia_ManForEachCo( pGia, pObj, i )
    {
        // create PO object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCos, hHandle );
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 1;
        pObjLog->nFanouts = 0;
        pObjLog->fCo = 1;
        // add fanins
        pFanLog = Frc_ManObj( p, Gia_ObjValue(Gia_ObjFanin0(pObj)) );
        Frc_ObjAddFanin( pObjLog, pFanLog );
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        p->nObjs++;
    }
    // connect registers
//    Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, i )
//        Frc_ObjAddFanin( Frc_ManObj(p,Gia_ObjValue(pObjRo)), Frc_ManObj(p,Gia_ObjValue(pObjRi)) );
    assert( nNodes  == Frc_ManNodeNum(p) );
    assert( hHandle == p->nObjData );
    if ( hHandle != p->nObjData )
        printf( "Frc_ManStartSimple(): Fatal error in internal representation.\n" );
    // make sure the fanin/fanout counters are correct
    Gia_ManForEachObj( pGia, pObj, i )
    {
        if ( !~Gia_ObjValue(pObj) )
            continue;
        pObjLog = Frc_ManObj( p, Gia_ObjValue(pObj) );
        assert( pObjLog->nFanins  == pObjLog->iFanin );
        assert( pObjLog->nFanouts == pObjLog->iFanout );
        pObjLog->iFanin = pObjLog->iFanout = 0;
    }
    ABC_FREE( pGia->pRefs );
    return p;
}